

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcTextLiteral::~IfcTextLiteral(IfcTextLiteral *this)

{
  _func_int *p_Var1;
  char *pcVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper + (long)p_Var3);
  pcVar2 = (this->Path).field_2._M_local_buf + (long)p_Var3;
  pcVar2[-0x70] = '8';
  pcVar2[-0x6f] = '\0';
  pcVar2[-0x6e] = -0x7d;
  pcVar2[-0x6d] = '\0';
  pcVar2[-0x6c] = '\0';
  pcVar2[-0x6b] = '\0';
  pcVar2[-0x6a] = '\0';
  pcVar2[-0x69] = '\0';
  pcVar2[0x10] = -0x50;
  pcVar2[0x11] = '\0';
  pcVar2[0x12] = -0x7d;
  pcVar2[0x13] = '\0';
  pcVar2[0x14] = '\0';
  pcVar2[0x15] = '\0';
  pcVar2[0x16] = '\0';
  pcVar2[0x17] = '\0';
  pcVar2[-0x60] = '`';
  pcVar2[-0x5f] = '\0';
  pcVar2[-0x5e] = -0x7d;
  pcVar2[-0x5d] = '\0';
  pcVar2[-0x5c] = '\0';
  pcVar2[-0x5b] = '\0';
  pcVar2[-0x5a] = '\0';
  pcVar2[-0x59] = '\0';
  pcVar2[-0x50] = -0x78;
  pcVar2[-0x4f] = '\0';
  pcVar2[-0x4e] = -0x7d;
  pcVar2[-0x4d] = '\0';
  pcVar2[-0x4c] = '\0';
  pcVar2[-0x4b] = '\0';
  pcVar2[-0x4a] = '\0';
  pcVar2[-0x49] = '\0';
  if (*(char **)(pcVar2 + -0x10) != pcVar2) {
    operator_delete(*(char **)(pcVar2 + -0x10));
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x58) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x58));
  }
  if (*(code **)(p_Var1 + 0x30) != p_Var1 + 0x40) {
    operator_delete(*(code **)(p_Var1 + 0x30));
  }
  operator_delete(p_Var1);
  return;
}

Assistant:

IfcTextLiteral() : Object("IfcTextLiteral") {}